

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O3

drmp3_bool32 drmp3_init_file(drmp3 *pMP3,char *filePath,drmp3_config *pConfig)

{
  drmp3_bool32 dVar1;
  FILE *pUserData;
  
  pUserData = fopen(filePath,"rb");
  if (pMP3 == (drmp3 *)0x0 || pUserData == (FILE *)0x0) {
    return 0;
  }
  memset(pMP3,0,0x52f0);
  dVar1 = drmp3_init_internal(pMP3,drmp3__on_read_stdio,drmp3__on_seek_stdio,pUserData,pConfig);
  return dVar1;
}

Assistant:

drmp3_bool32 drmp3_init_file(drmp3* pMP3, const char* filePath, const drmp3_config* pConfig)
{
    FILE* pFile;
#if defined(_MSC_VER) && _MSC_VER >= 1400
    if (fopen_s(&pFile, filePath, "rb") != 0) {
        return DRMP3_FALSE;
    }
#else
    pFile = fopen(filePath, "rb");
    if (pFile == NULL) {
        return DRMP3_FALSE;
    }
#endif

    return drmp3_init(pMP3, drmp3__on_read_stdio, drmp3__on_seek_stdio, (void*)pFile, pConfig);
}